

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::BasicInputLBase::Setup(BasicInputLBase *this)

{
  double *pdVar1;
  long lVar2;
  Vector<double,_4> local_40;
  
  this->m_po = 0;
  glu::CallLogWrapper::glGenBuffers
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_xfbo);
  for (lVar2 = 0; lVar2 != 0x400; lVar2 = lVar2 + 0x20) {
    tcu::Vector<double,_4>::Vector(&local_40,0.0);
    pdVar1 = (double *)((long)this->expected_data[0].m_data + lVar2 + 0x10);
    *pdVar1 = local_40.m_data[2];
    pdVar1[1] = local_40.m_data[3];
    pdVar1 = (double *)((long)this->expected_data[0].m_data + lVar2);
    *pdVar1 = local_40.m_data[0];
    pdVar1[1] = local_40.m_data[1];
  }
  this->instance_count = 1;
  this->base_instance = 0;
  return 0;
}

Assistant:

virtual long Setup()
	{
		m_po = 0;
		glGenBuffers(1, &m_xfbo);
		for (int i = 0; i < 32; ++i)
		{
			expected_data[i] = DVec4(0.0);
		}
		instance_count = 1;
		base_instance  = 0;
		return NO_ERROR;
	}